

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vorbis.c
# Opt level: O1

void vorbis_stream_destroy(vorbis_stream_t *vorbis)

{
  long lVar1;
  
  ogg_page_destroy(&vorbis->page);
  vorbis->segment = '\0';
  lVar1 = 8;
  do {
    ogg_page_destroy((ogg_page_t *)(vorbis->hdr_pages[0].position + lVar1 + -0xc));
    lVar1 = lVar1 + 0x148;
  } while (lVar1 != 0xcd8);
  buf_free(&vorbis->id_hdr);
  buf_free(&vorbis->comment_hdr);
  buf_free(&vorbis->setup_hdr);
  return;
}

Assistant:

void vorbis_stream_destroy(vorbis_stream_t *vorbis) {
  ogg_page_destroy(&vorbis->page);
  vorbis->segment = 0;

  int i;
  for (i = 0; i < VORBIS_MAX_HDR_PAGES; i++)
    ogg_page_destroy(vorbis->hdr_pages + i);

  buf_free(&vorbis->id_hdr);
  buf_free(&vorbis->comment_hdr);
  buf_free(&vorbis->setup_hdr);  
}